

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

BufferOrError * __thiscall
slang::SourceManager::readHeader
          (BufferOrError *__return_storage_ptr__,SourceManager *this,string_view path,
          SourceLocation includedFrom,SourceLibrary *library,bool isSystemPath,
          span<const_std::filesystem::__cxx11::path,_18446744073709551615UL> additionalIncludePaths)

{
  pointer ppVar1;
  char cVar2;
  FileInfo *pFVar3;
  char *pcVar4;
  pointer ppVar5;
  path *__lhs;
  long lVar6;
  shared_lock<std::shared_mutex> includeDirLock;
  shared_lock<std::shared_mutex> lock;
  path p;
  string_view path_local;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&p,&path_local,auto_format);
  cVar2 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar2 != '\0') {
    openCached(__return_storage_ptr__,this,&p,includedFrom,library,0xffffffffffffffff);
    goto LAB_001bc549;
  }
  if (!isSystemPath) {
    lock._M_owns = true;
    lock._M_pm = &this->mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pFVar3 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                       (this,(BufferID)(includedFrom._0_4_ & 0xfffffff),&lock);
    if ((pFVar3 == (FileInfo *)0x0) || (pFVar3->data == (FileData *)0x0)) {
      __lhs = (path *)0x0;
    }
    else {
      __lhs = pFVar3->data->directory;
    }
    std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
    if (__lhs != (path *)0x0) {
      std::filesystem::__cxx11::operator/((path *)&lock,__lhs,&p);
      openCached(__return_storage_ptr__,this,(path *)&lock,includedFrom,library,0xffffffffffffffff);
      std::filesystem::__cxx11::path::~path((path *)&lock);
      if ((__return_storage_ptr__->contained).
          super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false)
      goto LAB_001bc549;
    }
    lVar6 = additionalIncludePaths._M_extent._M_extent_value * 0x28;
    do {
      if (lVar6 == 0) {
        if (library == (SourceLibrary *)0x0) goto LAB_001bc4c1;
        ppVar5 = (library->includeDirs).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 = (library->includeDirs).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_001bc47c;
      }
      std::filesystem::__cxx11::operator/((path *)&lock,additionalIncludePaths._M_ptr,&p);
      openCached(__return_storage_ptr__,this,(path *)&lock,includedFrom,library,0xffffffffffffffff);
      std::filesystem::__cxx11::path::~path((path *)&lock);
      additionalIncludePaths._M_ptr = additionalIncludePaths._M_ptr + 1;
      lVar6 = lVar6 + -0x28;
    } while ((__return_storage_ptr__->contained).
             super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value == false);
    goto LAB_001bc549;
  }
  includeDirLock._M_pm = &this->includeDirMutex;
  includeDirLock._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(includeDirLock._M_pm)->_M_impl);
  ppVar5 = (this->systemDirectories).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->systemDirectories).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar5 == ppVar1) goto LAB_001bc52c;
    std::filesystem::__cxx11::operator/((path *)&lock,ppVar5,&p);
    openCached(__return_storage_ptr__,this,(path *)&lock,includedFrom,library,0xffffffffffffffff);
    std::filesystem::__cxx11::path::~path((path *)&lock);
    ppVar5 = ppVar5 + 1;
  } while ((__return_storage_ptr__->contained).
           super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value == false);
  goto LAB_001bc53f;
  while( true ) {
    std::filesystem::__cxx11::operator/((path *)&lock,ppVar5,&p);
    openCached(__return_storage_ptr__,this,(path *)&lock,includedFrom,library,0xffffffffffffffff);
    std::filesystem::__cxx11::path::~path((path *)&lock);
    ppVar5 = ppVar5 + 1;
    if ((__return_storage_ptr__->contained).
        super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value != false) break;
LAB_001bc47c:
    if (ppVar5 == ppVar1) goto LAB_001bc4c1;
  }
  goto LAB_001bc549;
LAB_001bc52c:
  pcVar4 = (char *)std::_V2::generic_category();
  (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
  m_has_value = false;
  (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
  field_0.m_error._M_value = 2;
  (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
  field_0.m_value.data._M_str = pcVar4;
  goto LAB_001bc53f;
LAB_001bc4c1:
  includeDirLock._M_pm = &this->includeDirMutex;
  includeDirLock._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(includeDirLock._M_pm)->_M_impl);
  ppVar5 = (this->userDirectories).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->userDirectories).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar5 == ppVar1) goto LAB_001bc52c;
    std::filesystem::__cxx11::operator/((path *)&lock,ppVar5,&p);
    openCached(__return_storage_ptr__,this,(path *)&lock,includedFrom,library,0xffffffffffffffff);
    std::filesystem::__cxx11::path::~path((path *)&lock);
    ppVar5 = ppVar5 + 1;
  } while ((__return_storage_ptr__->contained).
           super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value == false);
LAB_001bc53f:
  std::shared_lock<std::shared_mutex>::~shared_lock(&includeDirLock);
LAB_001bc549:
  std::filesystem::__cxx11::path::~path(&p);
  return __return_storage_ptr__;
}

Assistant:

SourceManager::BufferOrError SourceManager::readHeader(
    std::string_view path, SourceLocation includedFrom, const SourceLibrary* library,
    bool isSystemPath, std::span<std::filesystem::path const> additionalIncludePaths) {

    // if the header is specified as an absolute path, just do a straight lookup
    SLANG_ASSERT(!path.empty());
    fs::path p = path;
    if (p.is_absolute())
        return openCached(p, includedFrom, library);

    // system path lookups only look in system directories
    if (isSystemPath) {
        // Separate lock for the include dirs here so that we can iterate
        // over them without having to make a copy. It's unlikely that the
        // list is being modified while we're reading headers anyway.
        std::shared_lock<std::shared_mutex> includeDirLock(includeDirMutex);
        for (auto& d : systemDirectories) {
            auto result = openCached(d / p, includedFrom, library);
            if (result)
                return result;
        }
        return nonstd::make_unexpected(make_error_code(std::errc::no_such_file_or_directory));
    }

    // search relative to the current file
    const fs::path* currFileDir = nullptr;
    {
        std::shared_lock<std::shared_mutex> lock(mutex);
        auto info = getFileInfo(includedFrom.buffer(), lock);
        if (info && info->data)
            currFileDir = info->data->directory;
    }

    if (currFileDir) {
        auto result = openCached(*currFileDir / p, includedFrom, library);
        if (result)
            return result;
    }

    for (auto& dir : additionalIncludePaths) {
        auto result = openCached(dir / p, includedFrom, library);
        if (result)
            return result;
    }

    // Use library-specific include dirs if they exist.
    if (library) {
        for (auto& dir : library->includeDirs) {
            auto result = openCached(dir / p, includedFrom, library);
            if (result)
                return result;
        }
    }

    // See comment above about this separate mutex / lock.
    std::shared_lock<std::shared_mutex> includeDirLock(includeDirMutex);
    for (auto& d : userDirectories) {
        auto result = openCached(d / p, includedFrom, library);
        if (result)
            return result;
    }

    return nonstd::make_unexpected(make_error_code(std::errc::no_such_file_or_directory));
}